

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O0

LispPTR suspend_lisp(void)

{
  DLword DVar1;
  ushort uVar2;
  int iVar3;
  __pid_t __pgrp;
  DLword *pDVar4;
  KBEVENT *kbevent;
  DLword r;
  DLword w;
  
  iVar3 = device_before_raid();
  if (iVar3 < 0) {
    flush_pty();
    printf("Can\'t suspend\n");
    kbevent._4_4_ = 0;
  }
  else {
    flush_pty();
    printf("suspending...\n");
    __pgrp = getpgrp();
    killpg(__pgrp,0x14);
    flush_pty();
    printf("resuming\n");
    device_after_raid();
    DVar1 = CTopKeyevent[1];
    uVar2 = *CTopKeyevent;
    *(undefined2 *)((ulong)EmKbdAd068K ^ 2) = 0xffff;
    *(undefined2 *)((ulong)EmKbdAd168K ^ 2) = 0xffff;
    *(undefined2 *)((ulong)EmKbdAd268K ^ 2) = 0xffff;
    *(undefined2 *)((ulong)EmKbdAd368K ^ 2) = 0xffff;
    *(undefined2 *)((ulong)EmKbdAd468K ^ 2) = 0xffff;
    *(undefined2 *)((ulong)EmKbdAd568K ^ 2) = 0xffff;
    *(undefined2 *)((ulong)EmRealUtilin68K ^ 2) = 0xffff;
    pDVar4 = CTopKeyevent + (int)(uint)uVar2;
    pDVar4[1] = *(DLword *)((ulong)EmKbdAd068K ^ 2);
    *pDVar4 = *(DLword *)((ulong)EmKbdAd168K ^ 2);
    pDVar4[3] = *(DLword *)((ulong)EmKbdAd268K ^ 2);
    pDVar4[2] = *(DLword *)((ulong)EmKbdAd368K ^ 2);
    pDVar4[4] = *(DLword *)((ulong)EmKbdAd468K ^ 2);
    pDVar4[7] = *(DLword *)((ulong)EmKbdAd568K ^ 2);
    pDVar4[5] = *(DLword *)((ulong)EmRealUtilin68K ^ 2);
    if (DVar1 == 0) {
      CTopKeyevent[1] = uVar2;
    }
    if (uVar2 < 0x14f4) {
      *CTopKeyevent = uVar2 + 0xe;
    }
    else {
      *CTopKeyevent = 2;
    }
    kbevent._4_4_ = 0x4c;
  }
  return kbevent._4_4_;
}

Assistant:

LispPTR suspend_lisp(void) {
#ifndef DOS
  extern DLword *CTopKeyevent;
  extern LispPTR *KEYBUFFERING68k;

  DLword w, r;
  KBEVENT *kbevent;

  if (device_before_raid() < 0) {
    OSMESSAGE_PRINT(printf("Can't suspend\n"));
    return NIL;
  }

  OSMESSAGE_PRINT(printf("suspending...\n"));

/* Send a terminal-stop signal to the whole process-group, not
   just this process, so that if we are running as part of a
   C-shell file the shell will be suspended too. */
  killpg(getpgrp(), SIGTSTP);

  OSMESSAGE_PRINT(printf("resuming\n"));
  device_after_raid();

  r = RING_READ(CTopKeyevent);
  w = RING_WRITE(CTopKeyevent);

  /*NO CARE about event queue FULL */

  GETWORD(EmKbdAd068K) = KB_ALLUP;
  GETWORD(EmKbdAd168K) = KB_ALLUP;
  GETWORD(EmKbdAd268K) = KB_ALLUP;
  GETWORD(EmKbdAd368K) = KB_ALLUP;
  GETWORD(EmKbdAd468K) = KB_ALLUP;
  GETWORD(EmKbdAd568K) = KB_ALLUP;
  GETWORD(EmRealUtilin68K) = KB_ALLUP;

  kbevent = (KBEVENT *)(CTopKeyevent + w);

  /*    RCLK(kbevent->time); */

  kbevent->W0 = GETWORD(EmKbdAd068K);
  kbevent->W1 = GETWORD(EmKbdAd168K);
  kbevent->W2 = GETWORD(EmKbdAd268K);
  kbevent->W3 = GETWORD(EmKbdAd368K);
  kbevent->W4 = GETWORD(EmKbdAd468K);
  kbevent->W5 = GETWORD(EmKbdAd568K);
  kbevent->WU = GETWORD(EmRealUtilin68K);

  if (r == 0) /* Queue was empty */
    ((RING *)CTopKeyevent)->read = w;

  if (w >= MAXKEYEVENT)
    ((RING *)CTopKeyevent)->write = MINKEYEVENT;
  else
    ((RING *)CTopKeyevent)->write = w + KEYEVENTSIZE;
#endif /* DOS, which doesn't support suspend-lisp */
  return ATOM_T;
}